

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<StatementAstNode>_> * __thiscall
Parser::parseStatement
          (optional<std::shared_ptr<StatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  element_type *peVar2;
  optional<std::shared_ptr<StatementAstNode>_> local_e0;
  optional<std::shared_ptr<BlockStatementAstNode>_> local_c8;
  optional<std::shared_ptr<ReturnStatementAstNode>_> local_b0;
  optional<std::shared_ptr<BreakStatementAstNode>_> local_98;
  optional<std::shared_ptr<WhileStatementAstNode>_> local_80;
  optional<std::shared_ptr<IfStatementAstNode>_> local_68;
  optional<std::shared_ptr<DeclareStatementAstNode>_> local_48;
  undefined1 local_19;
  element_type *local_18;
  Parser *this_local;
  optional<std::shared_ptr<StatementAstNode>_> *s;
  
  local_18 = (element_type *)this;
  this_local = (Parser *)__return_storage_ptr__;
  skipWhiteSpace(this);
  local_19 = 0;
  std::optional<std::shared_ptr<StatementAstNode>_>::optional(__return_storage_ptr__);
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffd0);
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &stack0xffffffffffffffd0);
  TVar1 = peVar2->tokenType;
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffd0);
  switch(TVar1) {
  case LeftCurly:
    parseBlockStatement(&local_c8,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,&local_c8);
    std::optional<std::shared_ptr<BlockStatementAstNode>_>::~optional(&local_c8);
    skipWhiteSpace(this);
    break;
  default:
    parseAssignOrExpressionStatement(&local_e0,this);
    std::optional<std::shared_ptr<StatementAstNode>_>::operator=(__return_storage_ptr__,&local_e0);
    std::optional<std::shared_ptr<StatementAstNode>_>::~optional(&local_e0);
    skipWhiteSpace(this);
    break;
  case Return:
    parseReturnStatement(&local_b0,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,&local_b0);
    std::optional<std::shared_ptr<ReturnStatementAstNode>_>::~optional(&local_b0);
    skipWhiteSpace(this);
    break;
  case Break:
    parseBreakStatement(&local_98,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,&local_98);
    std::optional<std::shared_ptr<BreakStatementAstNode>_>::~optional(&local_98);
    skipWhiteSpace(this);
    break;
  case If:
    parseIfStatement(&local_68,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,&local_68);
    std::optional<std::shared_ptr<IfStatementAstNode>_>::~optional(&local_68);
    skipWhiteSpace(this);
    break;
  case While:
    parseWhileStatement(&local_80,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,&local_80);
    std::optional<std::shared_ptr<WhileStatementAstNode>_>::~optional(&local_80);
    skipWhiteSpace(this);
    break;
  case Var:
    parseDeclareStatement(&local_48,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,&local_48);
    std::optional<std::shared_ptr<DeclareStatementAstNode>_>::~optional(&local_48);
    skipWhiteSpace(this);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<StatementAstNode>>
Parser::parseStatement() noexcept {
  this->skipWhiteSpace();

  std::optional<std::shared_ptr<StatementAstNode>> s;

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::Var:
      s = this->parseDeclareStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::If:
      s = this->parseIfStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::While:
      s = this->parseWhileStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::Break:
      s = this->parseBreakStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::Return:
      s = this->parseReturnStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::LeftCurly:
      s = this->parseBlockStatement();
      this->skipWhiteSpace();
      return s;
    default:
      s = this->parseAssignOrExpressionStatement();
      this->skipWhiteSpace();
      return s;
  }
}